

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

Object * __thiscall flatbuffers::BinaryAnnotator::RootTable(BinaryAnnotator *this)

{
  ulong uVar1;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  BinaryAnnotator *local_18;
  BinaryAnnotator *this_local;
  
  local_18 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_00 = reflection::Schema::objects(this->schema_);
    std::__cxx11::string::string((string *)&local_38,(string *)&this->root_table_);
    this_local = (BinaryAnnotator *)
                 Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::
                 LookupByKey<std::__cxx11::string>
                           ((Vector<flatbuffers::Offset<reflection::Object>,unsigned_int> *)this_00,
                            &local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    this_local = (BinaryAnnotator *)reflection::Schema::root_table(this->schema_);
  }
  return (Object *)this_local;
}

Assistant:

const reflection::Object *BinaryAnnotator::RootTable() const {
  if (!root_table_.empty()) {
    return schema_->objects()->LookupByKey(root_table_);
  }
  return schema_->root_table();
}